

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderSwitchTests.cpp
# Opt level: O0

TestCase *
deqp::gles3::Functional::makeSwitchCase
          (Context *context,char *name,char *desc,SwitchType type,bool isVertex,
          LineStream *switchBody)

{
  size_t sVar1;
  ostream *poVar2;
  mapped_type *this;
  char *pcVar3;
  ShaderSwitchCase *this_00;
  char *fragSource;
  ShaderEvalFunc local_528;
  ShaderEvalFunc local_520;
  char *local_4b0;
  char *local_4a8;
  char *local_498;
  undefined1 *local_448;
  string local_438 [32];
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0;
  StringTemplate local_3d0;
  string local_3b0;
  allocator<char> local_389;
  key_type local_388;
  undefined1 local_368 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream *op;
  undefined1 local_320 [8];
  ostringstream frag;
  ostringstream vtx;
  LineStream *switchBody_local;
  bool isVertex_local;
  SwitchType type_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (isVertex) {
    local_448 = &frag.field_0x170;
  }
  else {
    local_448 = local_320;
  }
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_448;
  poVar2 = std::operator<<((ostream *)&frag.field_0x170,"#version 300 es\n");
  poVar2 = std::operator<<(poVar2,"in highp vec4 a_position;\n");
  std::operator<<(poVar2,"in highp vec4 a_coords;\n");
  poVar2 = std::operator<<((ostream *)local_320,"#version 300 es\n");
  std::operator<<(poVar2,"layout(location = 0) out mediump vec4 o_color;\n");
  if (isVertex) {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_320,"in mediump vec4 v_color;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"out highp vec4 v_coords;\n");
    std::operator<<((ostream *)local_320,"in highp vec4 v_coords;\n");
  }
  if (type == SWITCHTYPE_UNIFORM) {
    std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "uniform highp int ui_two;\n");
  }
  poVar2 = std::operator<<((ostream *)&frag.field_0x170,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"\tgl_Position = a_position;\n");
  poVar2 = std::operator<<((ostream *)local_320,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           "\thighp vec4 coords = ");
  if (isVertex) {
    local_498 = "a_coords";
  }
  else {
    local_498 = "v_coords";
  }
  poVar2 = std::operator<<(poVar2,local_498);
  std::operator<<(poVar2,";\n");
  std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\tmediump vec3 res = vec3(0.0);\n\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_368);
  if (type == SWITCHTYPE_STATIC) {
    local_4a8 = "2";
  }
  else {
    if (type == SWITCHTYPE_UNIFORM) {
      local_4b0 = "ui_two";
    }
    else {
      local_4b0 = "???";
      if (type == SWITCHTYPE_DYNAMIC) {
        local_4b0 = "int(floor(coords.z*1.5 + 2.0))";
      }
    }
    local_4a8 = local_4b0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"CONDITION",&local_389);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_368,&local_388);
  std::__cxx11::string::operator=((string *)this,local_4a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  sVar1 = params._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar3 = deqp::gls::LineStream::str(switchBody);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,pcVar3,&local_3f1);
  tcu::StringTemplate::StringTemplate(&local_3d0,&local_3f0);
  tcu::StringTemplate::specialize
            (&local_3b0,&local_3d0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_368);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)sVar1,pcVar3);
  std::__cxx11::string::~string((string *)&local_3b0);
  tcu::StringTemplate::~StringTemplate(&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::operator<<((ostream *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n");
  if (isVertex) {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = vec4(res, 1.0);\n");
    std::operator<<((ostream *)local_320,"\to_color = v_color;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_coords = a_coords;\n");
    std::operator<<((ostream *)local_320,"\to_color = vec4(res, 1.0);\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_320,"}\n");
  this_00 = (ShaderSwitchCase *)operator_new(0x128);
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::ostringstream::str();
  fragSource = (char *)std::__cxx11::string::c_str();
  if (type == SWITCHTYPE_STATIC) {
    local_520 = evalSwitchStatic;
  }
  else {
    if (type == SWITCHTYPE_UNIFORM) {
      local_528 = evalSwitchUniform;
    }
    else {
      local_528 = (ShaderEvalFunc)0x0;
      if (type == SWITCHTYPE_DYNAMIC) {
        local_528 = evalSwitchDynamic;
      }
    }
    local_520 = local_528;
  }
  ShaderSwitchCase::ShaderSwitchCase(this_00,context,name,desc,isVertex,pcVar3,fragSource,local_520)
  ;
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_418);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_368);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return (TestCase *)this_00;
}

Assistant:

static tcu::TestCase* makeSwitchCase (Context& context, const char* name, const char* desc, SwitchType type, bool isVertex, const LineStream& switchBody)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertex ? vtx : frag;

	vtx << "#version 300 es\n"
		<< "in highp vec4 a_position;\n"
		<< "in highp vec4 a_coords;\n";
	frag << "#version 300 es\n"
		 << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVertex)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out highp vec4 v_coords;\n";
		frag << "in highp vec4 v_coords;\n";
	}

	if (type == SWITCHTYPE_UNIFORM)
		op << "uniform highp int ui_two;\n";

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	// Setup.
	op << "	highp vec4 coords = " << (isVertex ? "a_coords" : "v_coords") << ";\n";
	op << "	mediump vec3 res = vec3(0.0);\n\n";

	// Switch body.
	map<string, string> params;
	params["CONDITION"] = type == SWITCHTYPE_STATIC		? "2"								:
						  type == SWITCHTYPE_UNIFORM	? "ui_two"							:
						  type == SWITCHTYPE_DYNAMIC	? "int(floor(coords.z*1.5 + 2.0))"	: "???";

	op << tcu::StringTemplate(switchBody.str()).specialize(params).c_str();
	op << "\n";

	if (isVertex)
	{
		vtx << "	v_color = vec4(res, 1.0);\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		vtx << "	v_coords = a_coords;\n";
		frag << "	o_color = vec4(res, 1.0);\n";
	}

	vtx << "}\n";
	frag << "}\n";

	return new ShaderSwitchCase(context, name, desc, isVertex, vtx.str().c_str(), frag.str().c_str(),
								type == SWITCHTYPE_STATIC	? evalSwitchStatic	:
								type == SWITCHTYPE_UNIFORM	? evalSwitchUniform	:
								type == SWITCHTYPE_DYNAMIC	? evalSwitchDynamic	: (ShaderEvalFunc)DE_NULL);
}